

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O0

int vrna_file_exists(char *filename)

{
  int iVar1;
  undefined1 local_a8 [8];
  stat buf;
  int r;
  char *filename_local;
  
  buf.__glibc_reserved[2]._4_4_ = 0;
  iVar1 = stat(filename,(stat *)local_a8);
  return (uint)(iVar1 == 0);
}

Assistant:

PUBLIC int
vrna_file_exists(const char *filename)
{
  int           r = 0;

#ifdef _WIN32
  struct _stat  buf;
  r = _stat(filename, &buf) == 0 ? 1 : 0;
#else
  struct stat   buf;
  r = stat(filename, &buf) == 0 ? 1 : 0;
#endif
  return r;
}